

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

VM * newVM(void)

{
  VM *vm;
  
  vm = (VM *)malloc(0x90);
  if (vm == (VM *)0x0) {
    errorReport((void *)0x0,ERROR_MEM,"allocate VM failed!");
  }
  initVM(vm);
  buildCore(vm);
  return vm;
}

Assistant:

VM *newVM() {
    VM *vm = (VM *) malloc(sizeof(VM));
    if (vm == NULL) {
        MEM_ERROR("allocate VM failed!");
    }
    initVM(vm);
    buildCore(vm);
    return vm;
}